

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation.cpp
# Opt level: O2

ostream * pstore::repo::operator<<(ostream *os,linkage l)

{
  ostream *poVar1;
  
  if (l < (weak_odr|internal)) {
    poVar1 = std::operator<<(os,&DAT_001cb248 + *(int *)(&DAT_001cb248 + (ulong)l * 4));
    return poVar1;
  }
  poVar1 = std::operator<<(os,"unknown");
  return poVar1;
}

Assistant:

std::ostream & pstore::repo::operator<< (std::ostream & os, linkage const l) {
    char const * str = "unknown";
    switch (l) {
#define X(a)                                                                                       \
    case linkage::a: str = #a; break;
        PSTORE_REPO_LINKAGES
#undef X
    }
    return os << str;
}